

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O2

void negate_twos_complement(uint8_t *buf,size_t len)

{
  uint8_t uVar1;
  ulong uVar2;
  byte bVar3;
  
  bVar3 = 0;
  for (uVar2 = len - 1; uVar2 < len; uVar2 = uVar2 - 1) {
    uVar1 = buf[uVar2];
    buf[uVar2] = -(bVar3 + uVar1);
    bVar3 = uVar1 != '\0' | bVar3;
  }
  return;
}

Assistant:

static void negate_twos_complement(uint8_t *buf, size_t len) {
  uint8_t borrow = 0;
  for (size_t i = len - 1; i < len; i--) {
    uint8_t t = buf[i];
    buf[i] = 0u - borrow - t;
    borrow |= t != 0;
  }
}